

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixTruncate(sqlite3_file *id,i64 nByte)

{
  int iLine;
  int *piVar1;
  char *in_RSI;
  unixFile *in_RDI;
  int rc;
  unixFile *pFile;
  sqlite3_int64 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  unixFile *puVar2;
  int errcode;
  int local_4;
  
  if (0 < in_RDI->szChunk) {
    in_RSI = (char *)(((long)(in_RSI + (long)in_RDI->szChunk + -1) / (long)in_RDI->szChunk) *
                     (long)in_RDI->szChunk);
  }
  puVar2 = in_RDI;
  iLine = robust_ftruncate((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),in_stack_ffffffffffffffc8
                          );
  errcode = (int)((ulong)puVar2 >> 0x20);
  if (iLine == 0) {
    if ((long)in_RSI < in_RDI->mmapSize) {
      in_RDI->mmapSize = (sqlite3_int64)in_RSI;
    }
    local_4 = 0;
  }
  else {
    puVar2 = in_RDI;
    piVar1 = __errno_location();
    storeLastErrno(in_RDI,*piVar1);
    local_4 = unixLogErrorAtLine(errcode,in_RSI,(char *)puVar2,iLine);
  }
  return local_4;
}

Assistant:

static int unixTruncate(sqlite3_file *id, i64 nByte){
  unixFile *pFile = (unixFile *)id;
  int rc;
  assert( pFile );
  SimulateIOError( return SQLITE_IOERR_TRUNCATE );

  /* If the user has configured a chunk-size for this file, truncate the
  ** file so that it consists of an integer number of chunks (i.e. the
  ** actual file size after the operation may be larger than the requested
  ** size).
  */
  if( pFile->szChunk>0 ){
    nByte = ((nByte + pFile->szChunk - 1)/pFile->szChunk) * pFile->szChunk;
  }

  rc = robust_ftruncate(pFile->h, nByte);
  if( rc ){
    storeLastErrno(pFile, errno);
    return unixLogError(SQLITE_IOERR_TRUNCATE, "ftruncate", pFile->zPath);
  }else{
#ifdef SQLITE_DEBUG
    /* If we are doing a normal write to a database file (as opposed to
    ** doing a hot-journal rollback or a write to some file other than a
    ** normal database file) and we truncate the file to zero length,
    ** that effectively updates the change counter.  This might happen
    ** when restoring a database using the backup API from a zero-length
    ** source.
    */
    if( pFile->inNormalWrite && nByte==0 ){
      pFile->transCntrChng = 1;
    }
#endif

#if SQLITE_MAX_MMAP_SIZE>0
    /* If the file was just truncated to a size smaller than the currently
    ** mapped region, reduce the effective mapping size as well. SQLite will
    ** use read() and write() to access data beyond this point from now on.
    */
    if( nByte<pFile->mmapSize ){
      pFile->mmapSize = nByte;
    }
#endif

    return SQLITE_OK;
  }
}